

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O2

void __thiscall
llvm::write_hex(llvm *this,raw_ostream *S,uint64_t N,HexPrintStyle Style,
               Optional<unsigned_long> Width)

{
  char cVar1;
  uint uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  undefined4 in_register_0000000c;
  unsigned_long uVar5;
  char *__n;
  uint uVar6;
  uint uVar7;
  char cVar8;
  undefined8 uStack_c0;
  char NumberBuffer [128];
  Optional<unsigned_long> Width_local;
  
  Width_local.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer._4_4_ = in_register_0000000c;
  Width_local.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer._0_4_ = Style;
  Width_local.Storage.hasVal = Width.Storage.storage.super_AlignedCharArray<8UL,_8UL>.buffer[0];
  NumberBuffer._0_8_ = NumberBuffer._0_8_ & 0xffffffff00000000;
  uStack_c0 = 0x18cafc;
  uVar3 = Optional<unsigned_long>::getValueOr<unsigned_int>(&Width_local,(uint *)NumberBuffer);
  uVar5 = 0x80;
  if (uVar3 < 0x80) {
    uVar5 = uVar3;
  }
  if (S == (raw_ostream *)0x0) {
    uVar4 = 0x40;
  }
  else {
    uVar4 = 0x3f;
    if (S != (raw_ostream *)0x0) {
      for (; (ulong)S >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    uVar4 = uVar4 ^ 0x3f;
  }
  uVar2 = (uint)N & 0xfffffffe;
  uVar6 = (uint)(0x43 - uVar4 >> 2);
  uVar7 = 1;
  if (1 < uVar6) {
    uVar7 = uVar6;
  }
  uVar7 = uVar7 + (uint)(uVar2 == 2) * 2;
  uVar6 = (uint)uVar5;
  if ((uint)uVar5 < uVar7) {
    uVar6 = uVar7;
  }
  builtin_strncpy(NumberBuffer + 0x70,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x60,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x50,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x40,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x30,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x20,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer + 0x10,"0000000000000000",0x10);
  builtin_strncpy(NumberBuffer,"0000000000000000",0x10);
  if (uVar2 == 2) {
    builtin_strncpy(NumberBuffer,"0x000000",8);
  }
  __n = (char *)((long)&uStack_c0 + 7 + (long)(ulong)uVar6);
  for (; S != (raw_ostream *)0x0; S = (raw_ostream *)((ulong)S >> 4)) {
    uVar7 = (uint)S & 0xf;
    cVar1 = (char)uVar7;
    cVar8 = cVar1 + '0';
    if (9 < uVar7) {
      cVar8 = ((N & 0xfffffffd) != 0) * ' ' + '7' + cVar1;
    }
    *__n = cVar8;
    __n = __n + -1;
  }
  uStack_c0 = 0x18cbc8;
  raw_ostream::write((raw_ostream *)this,(int)NumberBuffer,(void *)(ulong)uVar6,(size_t)__n);
  return;
}

Assistant:

void llvm::write_hex(raw_ostream &S, uint64_t N, HexPrintStyle Style,
                     Optional<size_t> Width) {
  const size_t kMaxWidth = 128u;

  size_t W = std::min(kMaxWidth, Width.getValueOr(0u));

  unsigned Nibbles = (64 - countLeadingZeros(N) + 3) / 4;
  bool Prefix = (Style == HexPrintStyle::PrefixLower ||
                 Style == HexPrintStyle::PrefixUpper);
  bool Upper =
      (Style == HexPrintStyle::Upper || Style == HexPrintStyle::PrefixUpper);
  unsigned PrefixChars = Prefix ? 2 : 0;
  unsigned NumChars =
      std::max(static_cast<unsigned>(W), std::max(1u, Nibbles) + PrefixChars);

  char NumberBuffer[kMaxWidth];
  ::memset(NumberBuffer, '0', llvm::array_lengthof(NumberBuffer));
  if (Prefix)
    NumberBuffer[1] = 'x';
  char *EndPtr = NumberBuffer + NumChars;
  char *CurPtr = EndPtr;
  while (N) {
    unsigned char x = static_cast<unsigned char>(N) % 16;
    *--CurPtr = hexdigit(x, !Upper);
    N /= 16;
  }

  S.write(NumberBuffer, NumChars);
}